

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_matcher.hpp
# Opt level: O0

Path * __thiscall
PathMatcher<int>::create_path
          (PathMatcher<int> *this,
          vector<PathMatcher<int>::Path_*,_std::allocator<PathMatcher<int>::Path_*>_> *parent,
          char character,optional<int> value)

{
  Path *this_00;
  Path *local_30;
  Path *route;
  vector<PathMatcher<int>::Path_*,_std::allocator<PathMatcher<int>::Path_*>_> *pvStack_20;
  char character_local;
  vector<PathMatcher<int>::Path_*,_std::allocator<PathMatcher<int>::Path_*>_> *parent_local;
  PathMatcher<int> *this_local;
  optional<int> value_local;
  
  route._7_1_ = character;
  pvStack_20 = parent;
  parent_local = (vector<PathMatcher<int>::Path_*,_std::allocator<PathMatcher<int>::Path_*>_> *)this
  ;
  this_local = (PathMatcher<int> *)
               value.super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int>;
  this_00 = (Path *)operator_new(0x28);
  Path::Path(this_00,route._7_1_,(optional<int>)this_local);
  local_30 = this_00;
  std::vector<PathMatcher<int>::Path_*,_std::allocator<PathMatcher<int>::Path_*>_>::push_back
            (pvStack_20,&local_30);
  return local_30;
}

Assistant:

Path *create_path(std::vector<Path *> &parent, char character, std::optional<Result> value) {
        Path *route = new Path(character, value);
        parent.push_back(route);
        return route;
    }